

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLibraryManager.cpp
# Opt level: O0

void __thiscall
CppUnit::DynamicLibraryManager::loadLibrary(DynamicLibraryManager *this,string *libraryName)

{
  LibraryHandle pvVar1;
  DynamicLibraryManagerException *this_00;
  string local_48;
  string *local_18;
  string *libraryName_local;
  DynamicLibraryManager *this_local;
  
  local_18 = libraryName;
  libraryName_local = (string *)this;
  releaseLibrary(this);
  pvVar1 = doLoadLibrary(this,local_18);
  this->m_libraryHandle = pvVar1;
  if (this->m_libraryHandle != (LibraryHandle)0x0) {
    return;
  }
  this_00 = (DynamicLibraryManagerException *)__cxa_allocate_exception(0x38);
  getLastErrorDetail_abi_cxx11_(&local_48,this);
  DynamicLibraryManagerException::DynamicLibraryManagerException
            (this_00,&this->m_libraryName,&local_48,loadingFailed);
  __cxa_throw(this_00,&DynamicLibraryManagerException::typeinfo,
              DynamicLibraryManagerException::~DynamicLibraryManagerException);
}

Assistant:

void
DynamicLibraryManager::loadLibrary( const std::string &libraryName )
{
  try
  {
    releaseLibrary();
    m_libraryHandle = doLoadLibrary( libraryName );
    if ( m_libraryHandle != NULL )
      return;
  }
  catch (...)
  {
  }

  throw DynamicLibraryManagerException( m_libraryName,
                                        getLastErrorDetail(),
                                        DynamicLibraryManagerException::loadingFailed );
}